

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TlsDirWrapper.cpp
# Opt level: O2

addr_type __thiscall
TlsDirWrapper::containsAddrType(TlsDirWrapper *this,size_t fieldId,size_t subField)

{
  return (uint)(fieldId < 4) * 3;
}

Assistant:

Executable::addr_type TlsDirWrapper::containsAddrType(size_t fieldId, size_t subField)
{
    switch (fieldId) {
        case START_ADDR :
        case END_ADDR :
        case INDEX_ADDR :
        case CALLBACKS_ADDR :
            return Executable::VA;
    }
    return Executable::NOT_ADDR;
}